

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInterval.cpp
# Opt level: O0

void anon_unknown.dwarf_5b268::testStream<short>(char *type)

{
  __type _Var1;
  ostream *poVar2;
  ostream *poVar3;
  char *in_RDI;
  stringstream s2;
  stringstream s1;
  Interval<short> b;
  short max;
  short min;
  Interval<short> *in_stack_fffffffffffffc68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc90;
  string local_350 [32];
  stringstream local_330 [408];
  stringstream local_198 [16];
  ostream local_188 [376];
  Interval<short> local_10;
  short local_c;
  short local_a;
  char *local_8;
  
  local_8 = in_RDI;
  poVar2 = std::operator<<((ostream *)&std::cout,"    hasVolume() for type ");
  poVar2 = std::operator<<(poVar2,local_8);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_a = 0;
  local_c = 1;
  Imath_3_2::Interval<short>::Interval(&local_10,&local_a,&local_c);
  std::__cxx11::stringstream::stringstream(local_198);
  poVar2 = std::operator<<(local_188,'(');
  poVar3 = (ostream *)std::ostream::operator<<(poVar2,local_a);
  poVar3 = std::operator<<(poVar3,' ');
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_c);
  std::operator<<(poVar3,')');
  std::__cxx11::stringstream::stringstream(local_330);
  Imath_3_2::operator<<(poVar3,in_stack_fffffffffffffc68);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::str();
  _Var1 = std::operator==(in_stack_fffffffffffffc90,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          poVar2);
  if (!_Var1) {
    __assert_fail("s1.str () == s2.str ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x2b6,"void (anonymous namespace)::testStream(const char *) [T = short]");
  }
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc90);
  std::__cxx11::string::~string(local_350);
  std::__cxx11::stringstream::~stringstream(local_330);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void
testStream (const char* type)
{
    cout << "    hasVolume() for type " << type << endl;

    T min (0);
    T max (1);

    IMATH_INTERNAL_NAMESPACE::Interval<T> b (min, max);
    std::stringstream                     s1;
    s1 << '(' << min << ' ' << max << ')';

    std::stringstream s2;
    s2 << b;

    assert (s1.str () == s2.str ());
}